

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common_avl.c
# Opt level: O2

void add_elements(tree_element *elements,_Bool do_random)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  tree_element *ptVar5;
  bool bVar6;
  _Bool added [6];
  
  if ((int)elements == 0) {
    lVar2 = 6;
    ptVar5 = nodes;
    while (bVar6 = lVar2 != 0, lVar2 = lVar2 + -1, bVar6) {
      (ptVar5->node).key = ptVar5;
      avl_insert(&head,&ptVar5->node);
      ptVar5 = ptVar5 + 1;
    }
  }
  else {
    for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
      added[lVar2] = false;
    }
    for (iVar4 = 0; iVar4 != 6; iVar4 = iVar4 + 1) {
      iVar1 = rand();
      for (uVar3 = (long)iVar1 % 6 & 0xffffffff; added[uVar3] == true;
          uVar3 = (ulong)((int)uVar3 + 1) % 6) {
      }
      nodes[uVar3].node.key = nodes + uVar3;
      avl_insert(&head);
      added[uVar3] = true;
    }
  }
  return;
}

Assistant:

static void add_elements(struct tree_element *elements, bool do_random) {
  uint32_t i;
  bool added[COUNT];

  if (do_random) {
    for (i=0; i<COUNT; i++) {
      added[i] = false;
    }

    for (i=0; i<COUNT; i++) {
      uint32_t num = rand() % COUNT;

      while (added[num]) {
        num = (num + 1) % COUNT;
      }

      elements[num].node.key = &elements[num].value;
      avl_insert(&head, &elements[num].node);
      added[num] = true;
    }
  }
  else {
    for (i=0; i<COUNT; i++) {
      elements[i].node.key = &elements[i].value;
      avl_insert(&head, &elements[i].node);
    }
  }
}